

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  long lVar1;
  QChar *pQVar2;
  QString *pQVar3;
  long lVar4;
  char16_t *pcVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  
  QVar6.m_data = *(p->a).a.a.a;
  QVar6.m_size = 0x13;
  QAbstractConcatenable::convertFromUtf8(QVar6,out);
  lVar1 = (p->a).a.a.b.d.size;
  if (lVar1 != 0) {
    pcVar5 = (p->a).a.a.b.d.ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar5,lVar1 * 2);
  }
  pQVar2 = *out;
  *out = pQVar2 + lVar1;
  pQVar3 = (p->a).a.b;
  lVar4 = (pQVar3->d).size;
  if (lVar4 != 0) {
    pcVar5 = (pQVar3->d).ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar2 + lVar1,pcVar5,lVar4 * 2);
  }
  *out = *out + lVar4;
  QVar7.m_data = *(p->a).b;
  QVar7.m_size = 4;
  QAbstractConcatenable::convertFromUtf8(QVar7,out);
  lVar1 = (p->b->d).size;
  if (lVar1 != 0) {
    pcVar5 = (p->b->d).ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar5,lVar1 * 2);
  }
  *out = *out + lVar1;
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }